

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

int __thiscall deqp::egl::ResizeTest::init(ResizeTest *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  CommandLine *commandLine;
  EglTestContext *pEVar1;
  NativeDisplay *nativeDisplay;
  PtrData<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> data;
  PtrData<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> data_00;
  PtrData<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> data_01;
  EGLenum surfaceType;
  int iVar2;
  deUint32 dVar3;
  EGLint EVar4;
  int extraout_EAX;
  Library *egl;
  EGLDisplay eglDisplay;
  EGLConfig config;
  undefined4 extraout_var;
  UniqueContext *this_01;
  NativeWindowFactory *pNVar5;
  undefined4 extraout_var_00;
  EGLSurface surface_00;
  UniqueSurface *this_02;
  undefined1 in_stack_fffffffffffffdd8 [12];
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> surface;
  MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> nativeWindow;
  MovePtr<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_> context;
  EGLint ctxAttribs [3];
  undefined1 local_1b0 [384];
  
  tcu::TestNode::init((TestNode *)this,ctx);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  commandLine = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine;
  eglDisplay = eglu::getAndInitDisplay
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,(Version *)0x0);
  surfaceType = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  config = getEGLConfig(egl,eglDisplay,surfaceType);
  iVar2 = (*egl->_vptr_Library[6])(egl,eglDisplay,config,0);
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x9e);
  this_01 = (UniqueContext *)operator_new(0x18);
  eglu::UniqueContext::UniqueContext
            (this_01,egl,eglDisplay,(EGLContext)CONCAT44(extraout_var,iVar2));
  context.super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.ptr
       = this_01;
  EVar4 = eglu::getConfigAttribInt(egl,eglDisplay,config,0x3028);
  eglu::parseWindowVisibility(commandLine);
  pEVar1 = (this->super_TestCase).m_eglTestCtx;
  nativeDisplay =
       (pEVar1->m_nativeDisplay).
       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.ptr;
  pNVar5 = eglu::selectNativeWindowFactory(pEVar1->m_nativeDisplayFactory,commandLine);
  iVar2 = (*(pNVar5->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar5,nativeDisplay,eglDisplay,config);
  nativeWindow.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
  ptr = (NativeWindow *)CONCAT44(extraout_var_00,iVar2);
  surface_00 = eglu::createWindowSurface
                         (nativeDisplay,
                          nativeWindow.
                          super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                          .m_data.ptr,eglDisplay,config,(EGLAttrib *)0x0);
  this_02 = (UniqueSurface *)operator_new(0x18);
  eglu::UniqueSurface::UniqueSurface(this_02,egl,eglDisplay,surface_00);
  local_1b0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  surface.super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr
       = this_02;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Chose EGLConfig with id ");
  std::ostream::operator<<(this_00,EVar4);
  std::operator<<((ostream *)this_00,".\n");
  std::operator<<((ostream *)this_00,"Created initial surface with size ");
  tcu::operator<<((ostream *)this_00,&this->m_oldSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2);
  this->m_config = config;
  surface.super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.ptr
       = (UniqueSurface *)0x0;
  data._12_4_ = EVar4;
  data._0_12_ = in_stack_fffffffffffffdd8;
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::assignData
            (&(this->m_surface).
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>,data);
  context.super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data.ptr
       = (UniqueContext *)0x0;
  data_00._12_4_ = EVar4;
  data_00._0_12_ = in_stack_fffffffffffffdd8;
  de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::assignData
            (&(this->m_context).
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>,
             data_00);
  this->m_display = eglDisplay;
  nativeWindow.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
  ptr = (NativeWindow *)0x0;
  data_01._12_4_ = EVar4;
  data_01._0_12_ = in_stack_fffffffffffffdd8;
  de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::assignData
            (&(this->m_nativeWindow).
              super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>,data_01)
  ;
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,"init",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0xc1);
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
  ~UniqueBase(&surface.
               super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
  de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniqueBase
            (&nativeWindow.
              super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
  de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::
  ~UniqueBase(&context.
               super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>);
  return extraout_EAX;
}

Assistant:

void ResizeTest::init (void)
{
	TestCase::init();

	const Library&				egl				= m_eglTestCtx.getLibrary();
	const CommandLine&			cmdLine			= m_testCtx.getCommandLine();
	const EGLDisplay			eglDisplay		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	const EGLConfig				eglConfig		= getEGLConfig(egl, eglDisplay, surfaceType());
	const EGLint				ctxAttribs[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	EGLContext					eglContext		= egl.createContext(eglDisplay,
																   eglConfig,
																   EGL_NO_CONTEXT,
																   ctxAttribs);
	EGLU_CHECK_MSG(egl, "eglCreateContext()");
	MovePtr<UniqueContext>		context			(new UniqueContext(egl, eglDisplay, eglContext));
	const EGLint				configId		= eglu::getConfigAttribInt(egl,
																		   eglDisplay,
																		   eglConfig,
																		   EGL_CONFIG_ID);
	const Visibility			visibility		= eglu::parseWindowVisibility(cmdLine);
	NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();
	const NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(),
																				  cmdLine);

	const WindowParams			windowParams	(m_oldSize.x(), m_oldSize.y(), visibility);
	MovePtr<NativeWindow>		nativeWindow	(windowFactory.createWindow(&nativeDisplay,
																			 eglDisplay,
																			 eglConfig,
																			 DE_NULL,
																			 windowParams));
	const EGLSurface			eglSurface		= eglu::createWindowSurface(nativeDisplay,
																			*nativeWindow,
																			eglDisplay,
																			eglConfig,
																			DE_NULL);
	MovePtr<UniqueSurface>		surface			(new UniqueSurface(egl, eglDisplay, eglSurface));

	m_log << TestLog::Message
		  << "Chose EGLConfig with id " << configId << ".\n"
		  << "Created initial surface with size " << m_oldSize
		  << TestLog::EndMessage;

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0));
	m_config		= eglConfig;
	m_surface		= surface;
	m_context		= context;
	m_display		= eglDisplay;
	m_nativeWindow	= nativeWindow;
	EGLU_CHECK_MSG(egl, "init");
}